

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

TestResult * tr_create(void)

{
  TestResult *pTVar1;
  
  pTVar1 = (TestResult *)emalloc(0x38);
  pTVar1->line = -1;
  pTVar1->rtype = CK_TEST_RESULT_INVALID;
  pTVar1->ctx = CK_CTX_INVALID;
  pTVar1->file = (char *)0x0;
  pTVar1->tcname = (char *)0x0;
  pTVar1->tname = (char *)0x0;
  pTVar1->msg = (char *)0x0;
  pTVar1->duration = -1;
  return pTVar1;
}

Assistant:

TestResult *tr_create(void)
{
    TestResult *tr;

    tr = (TestResult *)emalloc(sizeof(TestResult));
    tr_init(tr);
    return tr;
}